

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast(bad_value_cast *this,string *s,json_type actual)

{
  ostringstream msg;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  *(code **)&this->super_bad_cast = __cxa_guard_abort;
  booster::backtrace::backtrace(&(this->super_bad_cast).super_backtrace,0x20);
  *(undefined ***)&this->super_bad_cast = &PTR__bad_value_cast_00112be8;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_value_cast_00112c10;
  std::operator+(&this->msg_,"cppcms::json::bad_cast: ",s);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198," error converting from ",0x17);
  operator<<((ostream *)local_198,actual);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->msg_,(ulong)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual;
		msg_ +=msg.str();

	}